

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_parse_function_generator.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::ParseFunctionGenerator::GenerateParseIterationBody
          (ParseFunctionGenerator *this,Formatter *format,Descriptor *descriptor,
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          *ordered_fields)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint32_t local_40;
  uint32_t local_3c;
  uint32_t end_tag;
  uint32_t start_tag;
  ExtensionRange *range;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *pvStack_28;
  int i;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *ordered_fields_local;
  Descriptor *descriptor_local;
  Formatter *format_local;
  ParseFunctionGenerator *this_local;
  
  pvStack_28 = ordered_fields;
  ordered_fields_local =
       (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
        *)descriptor;
  descriptor_local = (Descriptor *)format;
  format_local = (Formatter *)this;
  Formatter::operator()<>
            (format,"$uint32$ tag;\nptr = ::$proto_ns$::internal::ReadTag(ptr, &tag);\n");
  bVar1 = std::
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ::empty(pvStack_28);
  if (!bVar1) {
    GenerateFieldSwitch(this,(Formatter *)descriptor_local,pvStack_28);
    Formatter::Outdent((Formatter *)descriptor_local);
    Formatter::operator()<>((Formatter *)descriptor_local,"handle_unusual:\n");
    Formatter::Indent((Formatter *)descriptor_local);
  }
  Formatter::operator()<>
            ((Formatter *)descriptor_local,
             "if ((tag == 0) || ((tag & 7) == 4)) {\n  CHK_(ptr);\n  ctx->SetLastTag(tag);\n  goto message_done;\n}\n"
            );
  bVar1 = IsMapEntryMessage((Descriptor *)ordered_fields_local);
  if (bVar1) {
    Formatter::operator()<>((Formatter *)descriptor_local,"$next_tag$;\n");
  }
  else {
    iVar2 = Descriptor::extension_range_count((Descriptor *)ordered_fields_local);
    if (0 < iVar2) {
      Formatter::operator()<>((Formatter *)descriptor_local,"if (");
      range._4_4_ = 0;
      while( true ) {
        iVar2 = range._4_4_;
        iVar3 = Descriptor::extension_range_count((Descriptor *)ordered_fields_local);
        if (iVar3 <= iVar2) break;
        _end_tag = Descriptor::extension_range((Descriptor *)ordered_fields_local,range._4_4_);
        if (0 < range._4_4_) {
          Formatter::operator()<>((Formatter *)descriptor_local," ||\n    ");
        }
        local_3c = internal::WireFormatLite::MakeTag(_end_tag->start,WIRETYPE_VARINT);
        local_40 = internal::WireFormatLite::MakeTag(_end_tag->end,WIRETYPE_VARINT);
        if (_end_tag->end < 0x20000000) {
          Formatter::operator()
                    ((Formatter *)descriptor_local,"($1$u <= tag && tag < $2$u)",&local_3c,&local_40
                    );
        }
        else {
          Formatter::operator()((Formatter *)descriptor_local,"($1$u <= tag)",&local_3c);
        }
        range._4_4_ = range._4_4_ + 1;
      }
      Formatter::operator()<>
                ((Formatter *)descriptor_local,
                 ") {\n  ptr = $msg$_extensions_.ParseField(tag, ptr, internal_default_instance(), &$msg$_internal_metadata_, ctx);\n  CHK_(ptr != nullptr);\n  $next_tag$;\n}\n"
                );
    }
    Formatter::operator()<>
              ((Formatter *)descriptor_local,
               "ptr = UnknownFieldParse(\n    tag,\n    $msg$_internal_metadata_.mutable_unknown_fields<$unknown_fields_type$>(),\n    ptr, ctx);\nCHK_(ptr != nullptr);\n"
              );
  }
  return;
}

Assistant:

void ParseFunctionGenerator::GenerateParseIterationBody(
    Formatter& format, const Descriptor* descriptor,
    const std::vector<const FieldDescriptor*>& ordered_fields) {
  format(
      "$uint32$ tag;\n"
      "ptr = ::$proto_ns$::internal::ReadTag(ptr, &tag);\n");

  if (!ordered_fields.empty()) {
    GenerateFieldSwitch(format, ordered_fields);
    // Each field `case` only considers field number. Field numbers that are
    // not defined in the message, or tags with an incompatible wire type, are
    // considered "unusual" cases. They will be handled by the logic below.
    format.Outdent();
    format("handle_unusual:\n");
    format.Indent();
  }

  // Unusual/extension/unknown case:
  format(
      "if ((tag == 0) || ((tag & 7) == 4)) {\n"
      "  CHK_(ptr);\n"
      "  ctx->SetLastTag(tag);\n"
      "  goto message_done;\n"
      "}\n");
  if (IsMapEntryMessage(descriptor)) {
    format("$next_tag$;\n");
  } else {
    if (descriptor->extension_range_count() > 0) {
      format("if (");
      for (int i = 0; i < descriptor->extension_range_count(); i++) {
        const Descriptor::ExtensionRange* range =
            descriptor->extension_range(i);
        if (i > 0) format(" ||\n    ");

        uint32_t start_tag = WireFormatLite::MakeTag(
            range->start, static_cast<WireFormatLite::WireType>(0));
        uint32_t end_tag = WireFormatLite::MakeTag(
            range->end, static_cast<WireFormatLite::WireType>(0));

        if (range->end > FieldDescriptor::kMaxNumber) {
          format("($1$u <= tag)", start_tag);
        } else {
          format("($1$u <= tag && tag < $2$u)", start_tag, end_tag);
        }
      }
      format(
          ") {\n"
          "  ptr = $msg$_extensions_.ParseField(tag, ptr, "
          "internal_default_instance(), &$msg$_internal_metadata_, ctx);\n"
          "  CHK_(ptr != nullptr);\n"
          "  $next_tag$;\n"
          "}\n");
    }
    format(
        "ptr = UnknownFieldParse(\n"
        "    tag,\n"
        "    $msg$_internal_metadata_.mutable_unknown_fields<"
        "$unknown_fields_type$>(),\n"
        "    ptr, ctx);\n"
        "CHK_(ptr != nullptr);\n");
  }
}